

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

void __thiscall
capnp::writeMessage(capnp *this,OutputStream *output,
                   ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  undefined1 *count;
  uint uVar1;
  DirectWireValue<unsigned_int> *pDVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  ArrayPtr<const_unsigned_char> *pAVar4;
  ArrayPtr<const_capnp::word> *pAVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  ulong count_00;
  size_t sVar7;
  Array<kj::ArrayPtr<const_unsigned_char>_> pieces_heap;
  Array<capnp::_::DirectWireValue<unsigned_int>_> table_heap;
  ArrayPtr<const_unsigned_char> pieces_stack [4];
  WireValue<uint32_t>_conflict table_stack [16];
  
  pAVar5 = segments.ptr;
  if (pAVar5 != (ArrayPtr<const_capnp::word> *)0x0) {
    count_00 = ((ulong)pAVar5 & 0xfffffffffffffffe) + 2;
    if (count_00 < 0x11) {
      table_heap.ptr = (DirectWireValue<unsigned_int> *)0x0;
      table_heap.size_ = 0;
      table_heap.disposer = (ArrayDisposer *)0x0;
      pDVar2 = table_stack;
    }
    else {
      pDVar2 = kj::_::HeapArrayDisposer::allocate<capnp::_::DirectWireValue<unsigned_int>>(count_00)
      ;
      table_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      table_heap.ptr = pDVar2;
      table_heap.size_ = count_00;
    }
    pDVar2->value = (int)segments.ptr - 1;
    for (uVar1 = 1; (ArrayPtr<const_capnp::word> *)(ulong)(uVar1 - 1) < pAVar5; uVar1 = uVar1 + 1) {
      pDVar2[uVar1].value = *(uint *)&output[(long)(ulong)(uVar1 - 1) * 2 + 1]._vptr_OutputStream;
    }
    if (((undefined1  [16])segments & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pDVar2[(long)((long)&pAVar5->ptr + 1)].value = 0;
    }
    count = (undefined1 *)((long)&pAVar5->ptr + 1);
    pieces_stack[3].ptr = (uchar *)0x0;
    pieces_stack[3].size_ = 0;
    pieces_stack[2].ptr = (uchar *)0x0;
    pieces_stack[2].size_ = 0;
    pieces_stack[1].ptr = (uchar *)0x0;
    pieces_stack[1].size_ = 0;
    pieces_stack[0].ptr = (uchar *)0x0;
    pieces_stack[0].size_ = 0;
    if (pAVar5 < (ArrayPtr<const_capnp::word> *)0x4) {
      pieces_heap.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
      pieces_heap.size_ = 0;
      pieces_heap.disposer = (ArrayDisposer *)0x0;
      pAVar3 = pieces_stack;
    }
    else {
      pAVar3 = kj::_::HeapArrayDisposer::allocate<kj::ArrayPtr<unsigned_char_const>>((size_t)count);
      pieces_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      pieces_heap.ptr = pAVar3;
      pieces_heap.size_ = (size_t)count;
    }
    sVar7 = count_00 * 4;
    pAVar3->ptr = (uchar *)pDVar2;
    uVar1 = 1;
    pAVar4 = pAVar3;
    while( true ) {
      pAVar6 = (ArrayPtr<const_capnp::word> *)(ulong)(uVar1 - 1);
      pAVar4->size_ = sVar7;
      if (pAVar5 <= pAVar6) break;
      sVar7 = (long)output[(long)pAVar6 * 2 + 1]._vptr_OutputStream << 3;
      pAVar4 = pAVar3 + uVar1;
      pAVar3[uVar1].ptr = (uchar *)output[(long)pAVar6 * 2]._vptr_OutputStream;
      uVar1 = uVar1 + 1;
    }
    (**(code **)(*(long *)this + 0x18))(this,pAVar3,count);
    kj::Array<kj::ArrayPtr<const_unsigned_char>_>::~Array(&pieces_heap);
    kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array(&table_heap);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            ((Fault *)table_stack,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0x11a,FAILED,"segments.size() > 0","\"Tried to serialize uninitialized message.\"",
             (char (*) [42])"Tried to serialize uninitialized message.");
  kj::_::Debug::Fault::fatal((Fault *)table_stack);
}

Assistant:

void writeMessage(kj::OutputStream& output, kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  KJ_STACK_ARRAY(_::WireValue<uint32_t>, table, (segments.size() + 2) & ~size_t(1), 16, 64);

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);
  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }
  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  KJ_STACK_ARRAY(kj::ArrayPtr<const byte>, pieces, segments.size() + 1, 4, 32);
  pieces[0] = table.asBytes();

  for (uint i = 0; i < segments.size(); i++) {
    pieces[i + 1] = segments[i].asBytes();
  }

  output.write(pieces);
}